

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t despace(char *bytes,size_t howmany)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = 0;
  if (howmany != 0) {
    sVar3 = 0;
    do {
      bVar1 = bytes[sVar3];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        bytes[sVar2] = bVar1;
        sVar2 = sVar2 + 1;
      }
      sVar3 = sVar3 + 1;
    } while (howmany != sVar3);
  }
  return sVar2;
}

Assistant:

size_t despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}